

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

void __thiscall xemmai::t_slot::t_queue<128UL>::f_next(t_queue<128UL> *this)

{
  t_engine *this_00;
  undefined8 *puVar1;
  t_object **pptVar2;
  t_object **pptVar3;
  t_object **pptVar4;
  
  puVar1 = (undefined8 *)__tls_get_addr(&PTR_0011ed28);
  this_00 = (t_engine *)*puVar1;
  t_engine::f_tick(this_00);
  if (this->v_head < this->v_objects + 0x7f) {
    pptVar2 = this->v_head + 1;
    this->v_head = pptVar2;
    pptVar3 = this->v_tail;
    while (pptVar3 == pptVar2) {
      t_engine::f_wait(this_00);
      pptVar2 = this->v_head;
      pptVar3 = this->v_tail;
    }
    pptVar4 = pptVar3 + -1;
    if (pptVar3 < pptVar2) {
      pptVar4 = this->v_objects + 0x7f;
    }
  }
  else {
    pptVar2 = this->v_objects;
    this->v_head = pptVar2;
    pptVar4 = this->v_tail;
    while (pptVar4 == pptVar2) {
      t_engine::f_wait(this_00);
      pptVar2 = this->v_head;
      pptVar4 = this->v_tail;
    }
    pptVar4 = pptVar4 + -1;
  }
  pptVar3 = pptVar2 + 0x10;
  if (pptVar4 <= pptVar2 + 0x10) {
    pptVar3 = pptVar4;
  }
  this->v_next = pptVar3;
  return;
}

Assistant:

void t_slot::t_queue<A_SIZE>::f_next() noexcept
{
	auto engine = f_engine();
	engine->f_tick();
	if (v_head < v_objects + A_SIZE - 1) {
		++v_head;
		while (v_tail == v_head) engine->f_wait();
		auto tail = v_tail;
		v_next = std::min(tail < v_head ? v_objects + A_SIZE - 1 : tail - 1, v_head + A_SIZE / 8);
	} else {
		v_head = v_objects;
		while (v_tail == v_head) engine->f_wait();
		v_next = std::min(v_tail - 1, v_head + A_SIZE / 8);
	}
}